

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

LessEqualLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_lessequal(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x33b) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x33b;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.lessequal_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::LessEqualLayerParams>
                   (arena);
    (this->layer_).lessequal_ = (LessEqualLayerParams *)LVar2;
  }
  return (LessEqualLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::LessEqualLayerParams* NeuralNetworkLayer::_internal_mutable_lessequal() {
  if (!_internal_has_lessequal()) {
    clear_layer();
    set_has_lessequal();
    layer_.lessequal_ = CreateMaybeMessage< ::CoreML::Specification::LessEqualLayerParams >(GetArenaForAllocation());
  }
  return layer_.lessequal_;
}